

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeAddedConstants.cpp
# Opt level: O2

void __thiscall
wasm::OptimizeAddedConstants::doWalkFunction(OptimizeAddedConstants *this,Function *func)

{
  Function *__p;
  Function *func_local;
  
  if ((((this->
        super_WalkerPass<wasm::PostWalker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>_>
        ).super_Pass.runner)->options).lowMemoryUnused == true) {
    while( true ) {
      this->propagated = false;
      std::
      _Rb_tree<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_unsigned_int>,_std::_Select1st<std::pair<wasm::LocalSet_*const,_unsigned_int>_>,_std::less<wasm::LocalSet_*>,_std::allocator<std::pair<wasm::LocalSet_*const,_unsigned_int>_>_>
      ::clear(&(this->helperIndexes)._M_t);
      std::
      _Rb_tree<wasm::LocalSet_*,_wasm::LocalSet_*,_std::_Identity<wasm::LocalSet_*>,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
      ::clear(&(this->propagatable)._M_t);
      if (this->propagate == true) {
        std::make_unique<wasm::LocalGraph,wasm::Function*&>(&func_local);
        __p = func_local;
        func_local = (Function *)0x0;
        std::__uniq_ptr_impl<wasm::LocalGraph,_std::default_delete<wasm::LocalGraph>_>::reset
                  ((__uniq_ptr_impl<wasm::LocalGraph,_std::default_delete<wasm::LocalGraph>_> *)
                   &this->localGraph,(pointer)__p);
        std::unique_ptr<wasm::LocalGraph,_std::default_delete<wasm::LocalGraph>_>::~unique_ptr
                  ((unique_ptr<wasm::LocalGraph,_std::default_delete<wasm::LocalGraph>_> *)
                   &func_local);
        LocalGraph::computeSetInfluences
                  ((this->localGraph)._M_t.
                   super___uniq_ptr_impl<wasm::LocalGraph,_std::default_delete<wasm::LocalGraph>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_wasm::LocalGraph_*,_std::default_delete<wasm::LocalGraph>_>
                   .super__Head_base<0UL,_wasm::LocalGraph_*,_false>._M_head_impl);
        LocalGraph::computeSSAIndexes
                  ((this->localGraph)._M_t.
                   super___uniq_ptr_impl<wasm::LocalGraph,_std::default_delete<wasm::LocalGraph>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_wasm::LocalGraph_*,_std::default_delete<wasm::LocalGraph>_>
                   .super__Head_base<0UL,_wasm::LocalGraph_*,_false>._M_head_impl);
        findPropagatable(this);
      }
      Walker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
      ::walk(&(this->
              super_WalkerPass<wasm::PostWalker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>_>
              ).
              super_PostWalker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
              .
              super_Walker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
             ,&func->body);
      if ((this->helperIndexes)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        createHelperIndexes(this);
      }
      if (this->propagated != true) break;
      cleanUpAfterPropagation(this);
    }
    return;
  }
  __assert_fail("getPassOptions().lowMemoryUnused",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/OptimizeAddedConstants.cpp"
                ,0x121,"void wasm::OptimizeAddedConstants::doWalkFunction(Function *)");
}

Assistant:

void doWalkFunction(Function* func) {
    // This pass is only valid under the assumption of unused low memory.
    assert(getPassOptions().lowMemoryUnused);
    // Multiple passes may be needed if we have x + 4 + 8 etc. (nested structs
    // in C can cause this, but it's rare). Note that we only need that for the
    // propagation case (as 4 + 8 would be optimized directly if it were
    // adjacent).
    while (1) {
      propagated = false;
      helperIndexes.clear();
      propagatable.clear();
      if (propagate) {
        localGraph = std::make_unique<LocalGraph>(func);
        localGraph->computeSetInfluences();
        localGraph->computeSSAIndexes();
        findPropagatable();
      }
      super::doWalkFunction(func);
      if (!helperIndexes.empty()) {
        createHelperIndexes();
      }
      if (propagated) {
        cleanUpAfterPropagation();
      } else {
        return;
      }
    }
  }